

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

bool pstore::json::is_valid(string *str)

{
  bool bVar1;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_c0;
  undefined1 local_a8 [8];
  parser<pstore::json::null_output> p;
  string *str_local;
  
  p.coordinate_ = (coord)str;
  parser<pstore::json::null_output>::parser((parser<pstore::json::null_output> *)local_a8,0);
  local_c0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::make_span<std::__cxx11::string>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        p.coordinate_);
  parser<pstore::json::null_output>::input<pstore::gsl::span<char_const,_1l>>
            ((parser<pstore::json::null_output> *)local_a8,(span<const_char,__1L> *)&local_c0);
  parser<pstore::json::null_output>::eof((parser<pstore::json::null_output> *)local_a8);
  bVar1 = parser<pstore::json::null_output>::has_error
                    ((parser<pstore::json::null_output> *)local_a8);
  parser<pstore::json::null_output>::~parser((parser<pstore::json::null_output> *)local_a8);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool is_valid (std::string const & str) {
            pstore::json::parser<pstore::json::null_output> p;
            p.input (pstore::gsl::make_span (str));
            p.eof ();
            return !p.has_error ();
        }